

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

string * absl::internal::(anonymous_namespace)::PrintHelp_abi_cxx11_(char *programname)

{
  bool bVar1;
  ostream *poVar2;
  element_type *peVar3;
  char *in_RSI;
  string *in_RDI;
  shared_ptr<absl::internal::FlagFunc> func;
  iterator __end2;
  iterator __begin2;
  FlagList *__range2;
  ostringstream os;
  ostream *in_stack_fffffffffffffdc8;
  ostream *in_stack_fffffffffffffdd0;
  __normal_iterator<std::shared_ptr<absl::internal::FlagFunc>_*,_std::vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>_>
  local_1a8;
  FlagList *local_1a0;
  ostringstream local_188 [376];
  char *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar2 = std::operator<<((ostream *)local_188,"sentencepiece");
  std::operator<<(poVar2,"\n\n");
  poVar2 = std::operator<<((ostream *)local_188,"Usage: ");
  poVar2 = std::operator<<(poVar2,local_10);
  std::operator<<(poVar2," [options] files\n\n");
  local_1a0 = anon_unknown_1::GetFlagList();
  local_1a8._M_current =
       (shared_ptr<absl::internal::FlagFunc> *)
       std::
       vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
       ::begin((vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
                *)in_stack_fffffffffffffdc8);
  std::
  vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
  ::end((vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>
         *)in_stack_fffffffffffffdc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<absl::internal::FlagFunc>_*,_std::vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>_>
                        *)in_stack_fffffffffffffdd0,
                       (__normal_iterator<std::shared_ptr<absl::internal::FlagFunc>_*,_std::vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>_>
                        *)in_stack_fffffffffffffdc8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<absl::internal::FlagFunc>_*,_std::vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>_>
    ::operator*(&local_1a8);
    std::shared_ptr<absl::internal::FlagFunc>::shared_ptr
              ((shared_ptr<absl::internal::FlagFunc> *)in_stack_fffffffffffffdd0,
               (shared_ptr<absl::internal::FlagFunc> *)in_stack_fffffffffffffdc8);
    poVar2 = std::operator<<((ostream *)local_188,"   --");
    peVar3 = std::
             __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x402a68);
    poVar2 = std::operator<<(poVar2,peVar3->name);
    poVar2 = std::operator<<(poVar2," (");
    peVar3 = std::
             __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x402a9e);
    poVar2 = std::operator<<(poVar2,peVar3->help);
    std::operator<<(poVar2,")");
    poVar2 = std::operator<<((ostream *)local_188,"  type: ");
    peVar3 = std::
             __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x402aeb);
    poVar2 = std::operator<<(poVar2,peVar3->type);
    in_stack_fffffffffffffdd0 = std::operator<<(poVar2," default: ");
    peVar3 = std::
             __shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x402b22);
    in_stack_fffffffffffffdc8 =
         std::operator<<(in_stack_fffffffffffffdd0,(string *)&peVar3->default_value);
    std::operator<<(in_stack_fffffffffffffdc8,'\n');
    std::shared_ptr<absl::internal::FlagFunc>::~shared_ptr
              ((shared_ptr<absl::internal::FlagFunc> *)0x402b53);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<absl::internal::FlagFunc>_*,_std::vector<std::shared_ptr<absl::internal::FlagFunc>,_std::allocator<std::shared_ptr<absl::internal::FlagFunc>_>_>_>
    ::operator++(&local_1a8);
  }
  std::operator<<((ostream *)local_188,"\n\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string PrintHelp(const char *programname) {
  std::ostringstream os;
  os << PACKAGE_STRING << "\n\n";
  os << "Usage: " << programname << " [options] files\n\n";

  for (auto func : *GetFlagList()) {
    os << "   --" << func->name << " (" << func->help << ")";
    os << "  type: " << func->type << " default: " << func->default_value
       << '\n';
  }

  os << "\n\n";

  return os.str();
}